

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_functype_t * wasm_functype_new(wasm_valtype_vec_t *params,wasm_valtype_vec_t *results)

{
  wasm_functype_t *this;
  FuncType *sig;
  wasm_functype_t *res;
  wasm_valtype_vec_t *results_local;
  wasm_valtype_vec_t *params_local;
  
  fprintf(_stderr,"CAPI: [%s] params=%zx args=%zx\n","wasm_functype_new",params->size,results->size)
  ;
  this = (wasm_functype_t *)operator_new(0x30);
  wasm_functype_t::wasm_functype_t(this,params,results);
  fprintf(_stderr,"CAPI: [%s] ","wasm_functype_new");
  sig = wasm_externtype_t::As<wabt::interp::FuncType>((wasm_externtype_t *)this);
  print_sig(sig);
  return this;
}

Assistant:

own wasm_functype_t* wasm_functype_new(own wasm_valtype_vec_t* params,
                                       own wasm_valtype_vec_t* results) {
  TRACE("params=%" PRIzx " args=%" PRIzx, params->size, results->size);
  auto* res = new wasm_functype_t{params, results};
  TRACE_NO_NL("");
  print_sig(*res->As<FuncType>());
  return res;
}